

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniform_quantization.cc
# Opt level: O1

void __thiscall
sptk::UniformQuantization::UniformQuantization
          (UniformQuantization *this,double absolute_maximum_value,int num_bit,
          QuantizationType quantization_type)

{
  int iVar1;
  double dVar2;
  
  this->_vptr_UniformQuantization = (_func_int **)&PTR__UniformQuantization_00110cc8;
  this->absolute_maximum_value_ = absolute_maximum_value;
  this->num_bit_ = num_bit;
  this->quantization_type_ = quantization_type;
  this->is_valid_ = true;
  if (absolute_maximum_value <= 0.0 || num_bit < 1) {
LAB_00104f0f:
    this->is_valid_ = false;
  }
  else {
    if (quantization_type == kMidTread) {
      dVar2 = ldexp(1.0,num_bit);
      iVar1 = (int)dVar2 + -1;
    }
    else {
      if (quantization_type != kMidRise) goto LAB_00104f0f;
      dVar2 = ldexp(1.0,num_bit);
      iVar1 = (int)dVar2;
    }
    this->quantization_levels_ = iVar1;
    this->inverse_step_size_ =
         (double)iVar1 / (this->absolute_maximum_value_ + this->absolute_maximum_value_);
  }
  return;
}

Assistant:

UniformQuantization::UniformQuantization(double absolute_maximum_value,
                                         int num_bit,
                                         QuantizationType quantization_type)
    : absolute_maximum_value_(absolute_maximum_value),
      num_bit_(num_bit),
      quantization_type_(quantization_type),
      is_valid_(true) {
  if (absolute_maximum_value_ <= 0.0 || num_bit_ <= 0) {
    is_valid_ = false;
    return;
  }

  switch (quantization_type_) {
    case kMidRise: {
      quantization_levels_ = static_cast<int>(std::pow(2.0, num_bit_));
      break;
    }
    case kMidTread: {
      quantization_levels_ = static_cast<int>(std::pow(2.0, num_bit_)) - 1;
      break;
    }
    default: {
      is_valid_ = false;
      return;
    }
  }

  inverse_step_size_ = quantization_levels_ / (2.0 * absolute_maximum_value_);
}